

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

BOOL __thiscall Js::GlobalObject::HasOwnItem(GlobalObject *this,uint32 index)

{
  RecyclableObject *pRVar1;
  PropertyQueryFlags PVar2;
  int iVar3;
  uint uVar4;
  
  PVar2 = DynamicObject::HasItemQuery((DynamicObject *)this,index);
  if (PVar2 == Property_Found) {
    uVar4 = 1;
  }
  else {
    pRVar1 = (this->directHostObject).ptr;
    if (pRVar1 == (RecyclableObject *)0x0) {
      uVar4 = 0;
    }
    else {
      iVar3 = (*(pRVar1->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x24])(pRVar1,index);
      uVar4 = (uint)(iVar3 == 1);
    }
  }
  return uVar4;
}

Assistant:

BOOL GlobalObject::HasOwnItem(uint32 index)
    {
        return JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasItemQuery(index))
            || (this->directHostObject && this->directHostObject->HasItem(index));
    }